

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_zstd_read_fse(uchar **ppin,uchar *pinend,uint16_t *zdebug_table,int maxidx,
                     elf_zstd_fse_entry *table,int *table_bits)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  uint32_t local_88;
  uint local_84;
  int zidx;
  int32_t count;
  uint32_t max;
  int prev0;
  int idx;
  int bits_needed;
  uint32_t threshold;
  uint32_t remaining;
  int accuracy_log;
  uint bits;
  uint64_t val;
  uint16_t *next;
  int16_t *norm;
  uchar *pin;
  int *table_bits_local;
  elf_zstd_fse_entry *table_local;
  uint16_t *puStack_28;
  int maxidx_local;
  uint16_t *zdebug_table_local;
  uchar *pinend_local;
  uchar **ppin_local;
  
  norm = (int16_t *)*ppin;
  val = (uint64_t)(zdebug_table + 0x100);
  next = zdebug_table;
  pin = (uchar *)table_bits;
  table_bits_local = (int *)table;
  table_local._4_4_ = maxidx;
  puStack_28 = zdebug_table;
  zdebug_table_local = (uint16_t *)pinend;
  pinend_local = (uchar *)ppin;
  if ((uchar *)((long)norm + 3U) < pinend) {
    _accuracy_log = 0;
    remaining = 0;
    for (; ((ulong)norm & 3) != 0; norm = (int16_t *)((long)norm + 1)) {
      _accuracy_log = (ulong)(byte)*norm << ((byte)remaining & 0x3f) | _accuracy_log;
      remaining = remaining + 8;
    }
    iVar1 = elf_fetch_bits((uchar **)&norm,pinend,(uint64_t *)&accuracy_log,&remaining);
    if (iVar1 == 0) {
      ppin_local._4_4_ = 0;
    }
    else {
      uVar2 = (uint)_accuracy_log & 0xf;
      iVar1 = uVar2 + 5;
      if (*(int *)pin < iVar1) {
        elf_uncompress_failed();
        ppin_local._4_4_ = 0;
      }
      else {
        *(int *)pin = iVar1;
        _accuracy_log = _accuracy_log >> 4;
        remaining = remaining - 4;
        bits_needed = (1 << (sbyte)iVar1) + 1;
        idx = 1 << (sbyte)iVar1;
        prev0 = uVar2 + 6;
        max = 0;
        bVar4 = false;
        while (1 < (uint)bits_needed && (int)max <= table_local._4_4_) {
          iVar1 = elf_fetch_bits((uchar **)&norm,(uchar *)zdebug_table_local,
                                 (uint64_t *)&accuracy_log,&remaining);
          if (iVar1 == 0) {
            return 0;
          }
          if (bVar4) {
            local_88 = max;
            while ((_accuracy_log & 0xfff) == 0xfff) {
              local_88 = local_88 + 0x12;
              _accuracy_log = _accuracy_log >> 0xc;
              remaining = remaining - 0xc;
              iVar1 = elf_fetch_bits((uchar **)&norm,(uchar *)zdebug_table_local,
                                     (uint64_t *)&accuracy_log,&remaining);
              if (iVar1 == 0) {
                return 0;
              }
            }
            while ((_accuracy_log & 3) == 3) {
              local_88 = local_88 + 3;
              _accuracy_log = _accuracy_log >> 2;
              remaining = remaining - 2;
              iVar1 = elf_fetch_bits((uchar **)&norm,(uchar *)zdebug_table_local,
                                     (uint64_t *)&accuracy_log,&remaining);
              if (iVar1 == 0) {
                return 0;
              }
            }
            iVar1 = local_88 + ((uint)_accuracy_log & 3);
            _accuracy_log = _accuracy_log >> 2;
            remaining = remaining - 2;
            if (table_local._4_4_ < iVar1) {
              elf_uncompress_failed();
              return 0;
            }
            for (; (int)max < iVar1; max = max + 1) {
              next[(int)max] = 0;
            }
            bVar4 = false;
          }
          else {
            uVar2 = (idx * 2 + -1) - bits_needed;
            bVar3 = (byte)prev0;
            if ((_accuracy_log & idx - 1) < (ulong)uVar2) {
              local_84 = (uint)_accuracy_log & idx - 1U;
              bVar3 = bVar3 - 1;
              iVar1 = prev0 + -1;
            }
            else {
              local_84 = (uint)_accuracy_log & idx * 2 - 1U;
              iVar1 = prev0;
              if (idx <= (int)local_84) {
                local_84 = local_84 - uVar2;
              }
            }
            _accuracy_log = _accuracy_log >> (bVar3 & 0x3f);
            remaining = remaining - iVar1;
            iVar1 = local_84 - 1;
            if (iVar1 < 0) {
              bits_needed = bits_needed + -1;
            }
            else {
              bits_needed = bits_needed - iVar1;
            }
            if (0xff < (int)max) {
              elf_uncompress_failed();
              return 0;
            }
            next[(int)max] = (uint16_t)iVar1;
            max = max + 1;
            bVar4 = iVar1 == 0;
            for (; (uint)bits_needed < (uint)idx; idx = (uint)idx >> 1) {
              prev0 = prev0 + -1;
            }
          }
        }
        if (bits_needed == 1) {
          for (; 7 < remaining; remaining = remaining - 8) {
            norm = (int16_t *)((long)norm + -1);
          }
          *(int16_t **)pinend_local = norm;
          for (; (int)max <= table_local._4_4_; max = max + 1) {
            next[(int)max] = 0;
          }
          ppin_local._4_4_ =
               elf_zstd_build_fse((int16_t *)next,max,(uint16_t *)val,*(int *)pin,
                                  (elf_zstd_fse_entry *)table_bits_local);
        }
        else {
          elf_uncompress_failed();
          ppin_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    elf_uncompress_failed();
    ppin_local._4_4_ = 0;
  }
  return ppin_local._4_4_;
}

Assistant:

static int
elf_zstd_read_fse (const unsigned char **ppin, const unsigned char *pinend,
		   uint16_t *zdebug_table, int maxidx,
		   struct elf_zstd_fse_entry *table, int *table_bits)
{
  const unsigned char *pin;
  int16_t *norm;
  uint16_t *next;
  uint64_t val;
  unsigned int bits;
  int accuracy_log;
  uint32_t remaining;
  uint32_t threshold;
  int bits_needed;
  int idx;
  int prev0;

  pin = *ppin;

  norm = (int16_t *) zdebug_table;
  next = zdebug_table + 256;

  if (unlikely (pin + 3 >= pinend))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Align PIN to a 32-bit boundary.  */

  val = 0;
  bits = 0;
  while ((((uintptr_t) pin) & 3) != 0)
    {
      val |= (uint64_t)*pin << bits;
      bits += 8;
      ++pin;
    }

  if (!elf_fetch_bits (&pin, pinend, &val, &bits))
    return 0;

  accuracy_log = (val & 0xf) + 5;
  if (accuracy_log > *table_bits)
    {
      elf_uncompress_failed ();
      return 0;
    }
  *table_bits = accuracy_log;
  val >>= 4;
  bits -= 4;

  /* This code is mostly copied from the reference implementation.  */

  /* The number of remaining probabilities, plus 1.  This sets the number of
     bits that need to be read for the next value.  */
  remaining = (1 << accuracy_log) + 1;

  /* The current difference between small and large values, which depends on
     the number of remaining values.  Small values use one less bit.  */
  threshold = 1 << accuracy_log;

  /* The number of bits used to compute threshold.  */
  bits_needed = accuracy_log + 1;

  /* The next character value.  */
  idx = 0;

  /* Whether the last count was 0.  */
  prev0 = 0;

  while (remaining > 1 && idx <= maxidx)
    {
      uint32_t max;
      int32_t count;

      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
	return 0;

      if (prev0)
	{
	  int zidx;

	  /* Previous count was 0, so there is a 2-bit repeat flag.  If the
	     2-bit flag is 0b11, it adds 3 and then there is another repeat
	     flag.  */
	  zidx = idx;
	  while ((val & 0xfff) == 0xfff)
	    {
	      zidx += 3 * 6;
	      val >>= 12;
	      bits -= 12;
	      if  (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  while ((val & 3) == 3)
	    {
	      zidx += 3;
	      val >>= 2;
	      bits -= 2;
	      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  /* We have at least 13 bits here, don't need to fetch.  */
	  zidx += val & 3;
	  val >>= 2;
	  bits -= 2;

	  if (unlikely (zidx > maxidx))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  for (; idx < zidx; idx++)
	    norm[idx] = 0;

	  prev0 = 0;
	  continue;
	}

      max = (2 * threshold - 1) - remaining;
      if ((val & (threshold - 1)) < max)
	{
	  /* A small value.  */
	  count = (int32_t) ((uint32_t) val & (threshold - 1));
	  val >>= bits_needed - 1;
	  bits -= bits_needed - 1;
	}
      else
	{
	  /* A large value.  */
	  count = (int32_t) ((uint32_t) val & (2 * threshold - 1));
	  if (count >= (int32_t) threshold)
	    count -= (int32_t) max;
	  val >>= bits_needed;
	  bits -= bits_needed;
	}

      count--;
      if (count >= 0)
	remaining -= count;
      else
	remaining--;
      if (unlikely (idx >= 256))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      norm[idx] = (int16_t) count;
      ++idx;

      prev0 = count == 0;

      while (remaining < threshold)
	{
	  bits_needed--;
	  threshold >>= 1;
	}
    }

  if (unlikely (remaining != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* If we've read ahead more than a byte, back up.  */
  while (bits >= 8)
    {
      --pin;
      bits -= 8;
    }

  *ppin = pin;

  for (; idx <= maxidx; idx++)
    norm[idx] = 0;

  return elf_zstd_build_fse (norm, idx, next, *table_bits, table);
}